

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void jinit_merged_upsampler(j_decompress_ptr cinfo)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long in_RDI;
  j_decompress_ptr unaff_retaddr;
  my_merged_upsample_ptr upsample;
  
  puVar2 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x58);
  *(undefined8 **)(in_RDI + 0x260) = puVar2;
  *puVar2 = start_pass_merged_upsample;
  *(undefined4 *)(puVar2 + 2) = 0;
  *(int *)((long)puVar2 + 0x4c) = *(int *)(in_RDI + 0x88) * *(int *)(in_RDI + 0x90);
  if (*(int *)(in_RDI + 0x19c) == 2) {
    puVar2[1] = merged_2v_upsample;
    iVar1 = jsimd_can_h2v2_merged_upsample();
    if (iVar1 == 0) {
      puVar2[3] = h2v2_merged_upsample;
    }
    else {
      puVar2[3] = jsimd_h2v2_merged_upsample;
    }
    if (*(int *)(in_RDI + 0x40) == 0x10) {
      if (*(int *)(in_RDI + 0x70) == 0) {
        puVar2[3] = h2v2_merged_upsample_565;
      }
      else {
        puVar2[3] = h2v2_merged_upsample_565D;
      }
    }
    uVar3 = (**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI,1,*(undefined4 *)((long)puVar2 + 0x4c));
    puVar2[8] = uVar3;
  }
  else {
    puVar2[1] = merged_1v_upsample;
    iVar1 = jsimd_can_h2v1_merged_upsample();
    if (iVar1 == 0) {
      puVar2[3] = h2v1_merged_upsample;
    }
    else {
      puVar2[3] = jsimd_h2v1_merged_upsample;
    }
    if (*(int *)(in_RDI + 0x40) == 0x10) {
      if (*(int *)(in_RDI + 0x70) == 0) {
        puVar2[3] = h2v1_merged_upsample_565;
      }
      else {
        puVar2[3] = h2v1_merged_upsample_565D;
      }
    }
    puVar2[8] = 0;
  }
  build_ycc_rgb_table(unaff_retaddr);
  return;
}

Assistant:

GLOBAL(void)
jinit_merged_upsampler(j_decompress_ptr cinfo)
{
  my_merged_upsample_ptr upsample;

  upsample = (my_merged_upsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_merged_upsampler));
  cinfo->upsample = (struct jpeg_upsampler *)upsample;
  upsample->pub.start_pass = start_pass_merged_upsample;
  upsample->pub.need_context_rows = FALSE;

  upsample->out_row_width = cinfo->output_width * cinfo->out_color_components;

  if (cinfo->max_v_samp_factor == 2) {
    upsample->pub.upsample = merged_2v_upsample;
    if (jsimd_can_h2v2_merged_upsample())
      upsample->upmethod = jsimd_h2v2_merged_upsample;
    else
      upsample->upmethod = h2v2_merged_upsample;
    if (cinfo->out_color_space == JCS_RGB565) {
      if (cinfo->dither_mode != JDITHER_NONE) {
        upsample->upmethod = h2v2_merged_upsample_565D;
      } else {
        upsample->upmethod = h2v2_merged_upsample_565;
      }
    }
    /* Allocate a spare row buffer */
    upsample->spare_row = (JSAMPROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                (size_t)(upsample->out_row_width * sizeof(JSAMPLE)));
  } else {
    upsample->pub.upsample = merged_1v_upsample;
    if (jsimd_can_h2v1_merged_upsample())
      upsample->upmethod = jsimd_h2v1_merged_upsample;
    else
      upsample->upmethod = h2v1_merged_upsample;
    if (cinfo->out_color_space == JCS_RGB565) {
      if (cinfo->dither_mode != JDITHER_NONE) {
        upsample->upmethod = h2v1_merged_upsample_565D;
      } else {
        upsample->upmethod = h2v1_merged_upsample_565;
      }
    }
    /* No spare row needed */
    upsample->spare_row = NULL;
  }

  build_ycc_rgb_table(cinfo);
}